

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_resp_make(http_resp **presp,int status,char *description)

{
  bool bVar1;
  http_resp *resp;
  char *pcVar2;
  CURLcode CVar3;
  
  resp = (http_resp *)(*Curl_ccalloc)(1,0x88);
  CVar3 = CURLE_OUT_OF_MEMORY;
  bVar1 = true;
  if (resp != (http_resp *)0x0) {
    resp->status = status;
    if (description != (char *)0x0) {
      pcVar2 = (*Curl_cstrdup)(description);
      resp->description = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_0013f745;
    }
    bVar1 = false;
    Curl_dynhds_init(&resp->headers,0,0x100000);
    Curl_dynhds_init(&resp->trailers,0,0x100000);
    CVar3 = CURLE_OK;
  }
LAB_0013f745:
  if (!(bool)(bVar1 ^ 1U | resp == (http_resp *)0x0)) {
    Curl_http_resp_free(resp);
  }
  if (bVar1) {
    resp = (http_resp *)0x0;
  }
  *presp = resp;
  return CVar3;
}

Assistant:

CURLcode Curl_http_resp_make(struct http_resp **presp,
                             int status,
                             const char *description)
{
  struct http_resp *resp;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  resp = calloc(1, sizeof(*resp));
  if(!resp)
    goto out;

  resp->status = status;
  if(description) {
    resp->description = strdup(description);
    if(!resp->description)
      goto out;
  }
  Curl_dynhds_init(&resp->headers, 0, DYN_HTTP_REQUEST);
  Curl_dynhds_init(&resp->trailers, 0, DYN_HTTP_REQUEST);
  result = CURLE_OK;

out:
  if(result && resp)
    Curl_http_resp_free(resp);
  *presp = result? NULL : resp;
  return result;
}